

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaFoodWeb_bnd.c
# Opt level: O1

void Fweb(sunrealtype tcalc,N_Vector cc,N_Vector crate,UserData webdata)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  sunrealtype **ppsVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  sunrealtype temp;
  double dVar18;
  
  lVar7 = 0;
  lVar9 = 0;
  do {
    dVar15 = (double)lVar7 * webdata->dy;
    lVar1 = lVar9 + 0x140;
    lVar11 = lVar1;
    if (lVar7 == 0x13) {
      lVar11 = lVar9 + -0x140;
    }
    lVar10 = lVar9 + -0x140;
    if (lVar7 == 0) {
      lVar10 = lVar1;
    }
    lVar13 = 0;
    do {
      dVar16 = webdata->dx;
      lVar3 = *(long *)((long)cc->content + 0x10);
      lVar12 = *(long *)((long)webdata->rates->content + 0x10);
      lVar4 = *(long *)((long)crate->content + 0x10);
      ppsVar5 = webdata->acoef;
      lVar2 = lVar3 + lVar9;
      lVar6 = 0;
      do {
        dVar18 = 0.0;
        lVar8 = 0;
        do {
          dVar18 = dVar18 + *(double *)(lVar2 + lVar8 * 8) * ppsVar5[lVar6][lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 == 1);
        *(double *)(lVar12 + (lVar7 * 0x28 + lVar13 * 2) * 8 + lVar6 * 8) = dVar18;
        bVar14 = lVar6 == 0;
        lVar6 = lVar6 + 1;
      } while (bVar14);
      dVar16 = dVar16 * (double)lVar13;
      dVar18 = sin(dVar16 * 12.5663706143592);
      dVar17 = sin(dVar15 * 12.5663706143592);
      lVar12 = lVar12 + lVar9;
      lVar6 = 0;
      do {
        *(double *)(lVar12 + lVar6 * 8) =
             (webdata->bcoef[lVar6] * (dVar17 * dVar18 * 1000.0 + dVar16 * 50.0 * dVar15 + 1.0) +
             *(double *)(lVar12 + lVar6 * 8)) * *(double *)(lVar2 + lVar6 * 8);
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      lVar6 = 0;
      do {
        dVar16 = *(double *)(lVar2 + lVar6);
        *(double *)(lVar4 + lVar9 + lVar6) =
             ((*(double *)(lVar3 + lVar11 + lVar6) - dVar16) -
             (dVar16 - *(double *)(lVar3 + lVar10 + lVar6))) *
             *(double *)((long)webdata->coy + lVar6) +
             ((*(double *)((ulong)(lVar13 != 0x13) * 0x20 + lVar9 + lVar3 + -0x10 + lVar6) - dVar16)
             - (dVar16 - *(double *)(lVar9 + ((ulong)(lVar13 == 0) * 4 + -2) * 8 + lVar3 + lVar6)))
             * *(double *)((long)webdata->cox + lVar6) + *(double *)(lVar12 + lVar6);
        lVar6 = lVar6 + 8;
      } while (lVar6 == 8);
      lVar13 = lVar13 + 1;
      lVar9 = lVar9 + 0x10;
      lVar11 = lVar11 + 0x10;
      lVar10 = lVar10 + 0x10;
    } while (lVar13 != 0x14);
    lVar7 = lVar7 + 1;
    lVar9 = lVar1;
  } while (lVar7 != 0x14);
  return;
}

Assistant:

static void Fweb(sunrealtype tcalc, N_Vector cc, N_Vector crate, UserData webdata)
{
  sunindextype jx, jy, is, idyu, idyl, idxu, idxl;
  sunrealtype xx, yy, *cxy, *ratesxy, *cratexy, dcyli, dcyui, dcxli, dcxui;

  /* Loop over grid points, evaluate interaction vector (length ns),
     form diffusion difference terms, and load crate.                    */

  for (jy = 0; jy < MY; jy++)
  {
    yy   = (webdata->dy) * jy;
    idyu = (jy != MY - 1) ? NSMX : -NSMX;
    idyl = (jy != 0) ? NSMX : -NSMX;

    for (jx = 0; jx < MX; jx++)
    {
      xx      = (webdata->dx) * jx;
      idxu    = (jx != MX - 1) ? NUM_SPECIES : -NUM_SPECIES;
      idxl    = (jx != 0) ? NUM_SPECIES : -NUM_SPECIES;
      cxy     = IJ_Vptr(cc, jx, jy);
      ratesxy = IJ_Vptr(webdata->rates, jx, jy);
      cratexy = IJ_Vptr(crate, jx, jy);

      /* Get interaction vector at this grid point. */
      WebRates(xx, yy, cxy, ratesxy, webdata);

      /* Loop over species, do differencing, load crate segment. */
      for (is = 0; is < NUM_SPECIES; is++)
      {
        /* Differencing in y. */
        dcyli = *(cxy + is) - *(cxy - idyl + is);
        dcyui = *(cxy + idyu + is) - *(cxy + is);

        /* Differencing in x. */
        dcxli = *(cxy + is) - *(cxy - idxl + is);
        dcxui = *(cxy + idxu + is) - *(cxy + is);

        /* Compute the crate values at (xx,yy). */
        cratexy[is] = coy[is] * (dcyui - dcyli) + cox[is] * (dcxui - dcxli) +
                      ratesxy[is];

      } /* End is loop */
    }   /* End of jx loop */
  }     /* End of jy loop */
}